

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool forwarding;
  SPIRType *pSVar1;
  spirv_cross local_300 [32];
  spirv_cross local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [8];
  string expr;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [80];
  spirv_cross local_1d0 [32];
  string local_1b0 [8];
  string cast_op;
  undefined1 local_190 [8];
  SPIRType expected_type;
  SPIRType *expr_type;
  SPIRType *out_type;
  TypedID<(spirv_cross::Types)0> *pTStack_28;
  BaseType input_type_local;
  char *op_local;
  uint32_t local_18;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pTStack_28 = (TypedID<(spirv_cross::Types)0> *)op;
  op_local._4_4_ = op0;
  local_18 = result_id;
  op0_local = result_type;
  _result_id_local = this;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::expression_type(&this->super_Compiler,op_local._4_4_);
  SPIRType::SPIRType((SPIRType *)local_190,pSVar1);
  expected_type.super_IVariant.self.id =
       *(uint32_t *)&expected_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt;
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type;
  ::std::__cxx11::string::string(local_1b0);
  if (*(BaseType *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) ==
      input_type) {
    to_unpacked_expression_abi_cxx11_
              ((CompilerGLSL *)local_260,(uint32_t)this,SUB41(op_local._4_4_,0));
    ::std::__cxx11::string::operator=(local_1b0,(string *)local_260);
    ::std::__cxx11::string::~string((string *)local_260);
  }
  else if (*(int *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) == 2
          ) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_220 + 0x30,this,local_190,0);
    to_unpacked_expression_abi_cxx11_
              ((CompilerGLSL *)local_220,(uint32_t)this,SUB41(op_local._4_4_,0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_220 + 0x30),(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator=(local_1b0,(string *)local_1d0);
    ::std::__cxx11::string::~string((string *)local_1d0);
    ::std::__cxx11::string::~string((string *)local_220);
    ::std::__cxx11::string::~string((string *)(local_220 + 0x30));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_240,(SPIRType *)this,(uint32_t)local_190);
    ::std::__cxx11::string::operator=(local_1b0,(string *)local_240);
    ::std::__cxx11::string::~string((string *)local_240);
  }
  ::std::__cxx11::string::string(local_280);
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (local_300,(char **)&stack0xffffffffffffffd8,(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator+=(local_280,(string *)local_300);
    ::std::__cxx11::string::~string((string *)local_300);
  }
  else {
    expected_type.super_IVariant._vptr_IVariant._4_4_ = expected_result_type;
    expected_type.super_IVariant.self.id = pSVar1->width;
    if (*(int *)&(pSVar1->super_IVariant).field_0xc == 2) {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_2a0,this,pSVar1,0);
      ::std::__cxx11::string::operator=(local_280,local_2a0);
      ::std::__cxx11::string::~string(local_2a0);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x38])(local_2c0,this,pSVar1,local_190);
      ::std::__cxx11::string::operator=(local_280,local_2c0);
      ::std::__cxx11::string::~string(local_2c0);
    }
    ::std::__cxx11::string::operator+=(local_280,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (local_2e0,(char **)&stack0xffffffffffffffd8,(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator+=(local_280,(string *)local_2e0);
    ::std::__cxx11::string::~string((string *)local_2e0);
    ::std::__cxx11::string::operator+=(local_280,')');
  }
  result_type_00 = op0_local;
  result_id_00 = local_18;
  forwarding = should_forward(this,op_local._4_4_);
  emit_op(this,result_type_00,result_id_00,(string *)local_280,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,op_local._4_4_);
  ::std::__cxx11::string::~string(local_280);
  ::std::__cxx11::string::~string(local_1b0);
  SPIRType::~SPIRType((SPIRType *)local_190);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;

	string cast_op;
	if (expr_type.basetype != input_type)
	{
		if (expr_type.basetype == SPIRType::Boolean)
			cast_op = join(type_to_glsl(expected_type), "(", to_unpacked_expression(op0), ")");
		else
			cast_op = bitcast_glsl(expected_type, op0);
	}
	else
		cast_op = to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		if (out_type.basetype == SPIRType::Boolean)
			expr = type_to_glsl(out_type);
		else
			expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}